

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_load_pnm(CImg<unsigned_char> *this,FILE *file,char *filename)

{
  uint uVar1;
  CImg<unsigned_char> *pCVar2;
  int iVar3;
  FILE *__stream;
  byte *pbVar4;
  long lVar5;
  CImgArgumentException *this_00;
  CImgIOException *this_01;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  uchar *puVar10;
  uchar *puVar11;
  uint uVar12;
  uchar *puVar13;
  byte bVar14;
  char *pcVar15;
  char *pcVar16;
  uint uVar17;
  ulong uVar18;
  uint H;
  uint W;
  uint D;
  CImg<unsigned_char> raw;
  int rval;
  uint colormax;
  FILE *local_80;
  uint ppm_type;
  CImg<unsigned_char> *local_70;
  int local_64;
  int bval;
  int gval;
  CImg<char> item;
  
  if (file == (FILE *)0x0 && filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar15 = "non-";
    if (this->_is_shared != false) {
      pcVar15 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pnm(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar15,"unsigned char");
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  __stream = (FILE *)file;
  if (file == (FILE *)0x0) {
    __stream = cimg::fopen(filename,"rb");
  }
  D = 1;
  colormax = 0xff;
  raw._0_8_ = raw._0_8_ & 0xffffffffffffff00;
  CImg<char>::CImg(&item,0x4000,1,1,1,(char *)&raw);
  while ((iVar3 = __isoc99_fscanf(__stream,"%16383[^\n]",item._data), iVar3 != -1 &&
         (iVar3 == 0 || *item._data == '#'))) {
    fgetc(__stream);
  }
  iVar3 = __isoc99_sscanf(item._data," P%u",&ppm_type);
  if (iVar3 != 1) {
    if (file == (FILE *)0x0) {
      cimg::fclose(__stream);
    }
    this_01 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar15 = "non-";
    if (this->_is_shared != false) {
      pcVar15 = "";
    }
    pcVar16 = "(FILE*)";
    if (filename != (char *)0x0) {
      pcVar16 = filename;
    }
    CImgIOException::CImgIOException
              (this_01,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pnm(): PNM header not found in file \'%s\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar15,"unsigned char",pcVar16);
LAB_001a3563:
    __cxa_throw(this_01,&CImgIOException::typeinfo,CImgException::~CImgException);
  }
  while ((iVar3 = __isoc99_fscanf(__stream," %16383[^\n]",item._data), iVar3 != -1 &&
         (iVar3 == 0 || *item._data == '#'))) {
    fgetc(__stream);
  }
  iVar3 = __isoc99_sscanf(item._data," %u %u %u %u",&W,&H,&D,&colormax);
  if (iVar3 < 2) {
    if (file == (FILE *)0x0) {
      cimg::fclose(__stream);
    }
    this_01 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar15 = "non-";
    if (this->_is_shared != false) {
      pcVar15 = "";
    }
    pcVar16 = "(FILE*)";
    if (filename != (char *)0x0) {
      pcVar16 = filename;
    }
    CImgIOException::CImgIOException
              (this_01,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pnm(): WIDTH and HEIGHT fields undefined in file \'%s\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar15,"unsigned char",pcVar16);
    goto LAB_001a3563;
  }
  if ((ppm_type != 1) && (ppm_type != 4)) {
    if ((iVar3 == 2) ||
       (((iVar3 == 3 && (ppm_type < 10)) && ((0x3a0U >> (ppm_type & 0x1f) & 1) != 0)))) {
      while ((iVar3 = __isoc99_fscanf(__stream," %16383[^\n]",item._data), iVar3 != -1 &&
             (iVar3 == 0 || *item._data == '#'))) {
        fgetc(__stream);
      }
      iVar3 = __isoc99_sscanf(item._data,"%u",&colormax);
      if (iVar3 != 1) {
        pcVar15 = "non-";
        if (this->_is_shared != false) {
          pcVar15 = "";
        }
        pcVar16 = "(FILE*)";
        if (filename != (char *)0x0) {
          pcVar16 = filename;
        }
        cimg::warn("[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pnm(): COLORMAX field is undefined in file \'%s\'."
                   ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                   (ulong)this->_spectrum,this->_data,pcVar15,"unsigned char",pcVar16);
      }
    }
    else {
      colormax = D;
      D = 1;
    }
  }
  fgetc(__stream);
  local_80 = __stream;
  local_70 = this;
  switch(ppm_type) {
  case 1:
    assign(this,W,H,1,1);
    puVar11 = this->_data;
    uVar9 = this->_width;
    uVar12 = this->_height;
    uVar17 = this->_depth;
    uVar1 = this->_spectrum;
    lVar5 = 0;
    while (((ulong)uVar1 * (ulong)uVar17 * (ulong)uVar12 * (ulong)uVar9 - lVar5 != 0 &&
           (iVar3 = __isoc99_fscanf(local_80,"%d",&rval), 0 < iVar3))) {
      puVar11[lVar5] = -(rval == 0);
      lVar5 = lVar5 + 1;
    }
    break;
  case 2:
    assign(this,W,H,1,1);
    puVar11 = this->_data;
    uVar9 = this->_width;
    uVar12 = this->_height;
    uVar17 = this->_depth;
    uVar1 = this->_spectrum;
    lVar5 = 0;
    while (((ulong)uVar1 * (ulong)uVar17 * (ulong)uVar12 * (ulong)uVar9 - lVar5 != 0 &&
           (iVar3 = __isoc99_fscanf(local_80,"%d",&rval), 0 < iVar3))) {
      puVar11[lVar5] = (uchar)rval;
      lVar5 = lVar5 + 1;
    }
    break;
  case 3:
    assign(this,W,H,1,3);
    puVar10 = this->_data;
    uVar18 = (ulong)this->_height;
    lVar5 = this->_width * uVar18 * (ulong)this->_depth;
    puVar11 = puVar10 + lVar5;
    puVar13 = puVar10 + lVar5 * 2;
    iVar3 = 0;
    while (iVar3 < (int)uVar18) {
      lVar5 = 0;
      local_64 = iVar3;
      while (((int)lVar5 < (int)local_70->_width &&
             (iVar3 = __isoc99_fscanf(local_80,"%d %d %d",&rval,&gval,&bval), iVar3 == 3))) {
        puVar10[lVar5] = (uchar)rval;
        puVar11[lVar5] = (uchar)gval;
        puVar13[lVar5] = (uchar)bval;
        lVar5 = lVar5 + 1;
      }
      uVar18 = (ulong)local_70->_height;
      puVar10 = puVar10 + lVar5;
      puVar11 = puVar11 + lVar5;
      puVar13 = puVar13 + lVar5;
      iVar3 = local_64 + 1;
    }
    break;
  case 4:
    raw._data = (uchar *)0x0;
    raw._width = 0;
    raw._height = 0;
    raw._depth = 0;
    raw._spectrum = 0;
    raw._is_shared = false;
    assign(this,W,H,D,1);
    puVar11 = this->_data;
    uVar18 = (ulong)(D * H * (((W >> 3) + 1) - (uint)((W & 7) == 0)));
    uVar17 = 0;
    uVar9 = 0;
    uVar12 = 0;
LAB_001a2f3b:
    if (0 < (long)uVar18) {
      uVar7 = 0x1800000;
      if (uVar18 < 0x1800000) {
        uVar7 = uVar18;
      }
      assign(&raw,(uint)uVar7,1,1,1);
      cimg::fread<unsigned_char>(raw._data,raw._0_8_ & 0xffffffff,(FILE *)__stream);
      uVar18 = uVar18 - (raw._0_8_ & 0xffffffff);
      bVar8 = 0;
      pbVar4 = raw._data;
      uVar7 = raw._0_8_ & 0xffffffff;
      for (bVar14 = 0; bVar14 != 0 || uVar7 != 0; bVar14 = bVar14 >> 1) {
        uVar6 = uVar7;
        if ((bVar14 == 0) && (bVar14 = 0x80, uVar6 = 0xffffffffffffffff, uVar7 != 0)) {
          bVar8 = *pbVar4;
          pbVar4 = pbVar4 + 1;
          uVar6 = uVar7 - 1;
        }
        *puVar11 = -((bVar8 & bVar14) == 0);
        uVar17 = uVar17 + 1;
        if (uVar17 == W) {
          uVar9 = uVar9 + 1;
          if (uVar9 == H) {
            uVar12 = uVar12 + 1;
            if (uVar12 == D) {
              puVar11 = puVar11 + 1;
              uVar17 = 0;
              uVar9 = 0;
              break;
            }
            uVar9 = 0;
          }
          uVar17 = 0;
          bVar14 = 0;
        }
        puVar11 = puVar11 + 1;
        uVar7 = uVar6;
      }
      goto LAB_001a2f3b;
    }
    goto LAB_001a33be;
  case 5:
  case 7:
    if (0xff < colormax) {
      raw._data = (uchar *)0x0;
      raw._width = 0;
      raw._height = 0;
      raw._depth = 0;
      raw._spectrum = 0;
      raw._is_shared = false;
      assign(this,W,H,D,1);
      puVar11 = this->_data;
      for (uVar18 = (ulong)this->_spectrum * (ulong)this->_depth *
                    (ulong)this->_height * (ulong)this->_width; 0 < (long)uVar18;
          uVar18 = uVar18 - (raw._0_8_ & 0xffffffff)) {
        uVar7 = 0xc00000;
        if (uVar18 < 0xc00000) {
          uVar7 = uVar18;
        }
        CImg<unsigned_short>::assign((CImg<unsigned_short> *)&raw,(uint)uVar7,1,1,1);
        cimg::fread<unsigned_short>
                  ((unsigned_short *)raw._data,raw._0_8_ & 0xffffffff,(FILE *)local_80);
        cimg::invert_endianness<unsigned_short>((unsigned_short *)raw._data,raw._0_8_ & 0xffffffff);
        for (uVar7 = 0; (raw._0_8_ & 0xffffffff) != uVar7; uVar7 = uVar7 + 1) {
          puVar11[uVar7] = raw._data[uVar7 * 2];
        }
        puVar11 = puVar11 + uVar7;
      }
LAB_001a33ca:
      CImg<unsigned_short>::~CImg((CImg<unsigned_short> *)&raw);
      break;
    }
    raw._data = (uchar *)0x0;
    raw._width = 0;
    raw._height = 0;
    raw._depth = 0;
    raw._spectrum = 0;
    raw._is_shared = false;
    assign(this,W,H,D,1);
    puVar11 = this->_data;
    for (uVar18 = (ulong)this->_spectrum * (ulong)this->_depth *
                  (ulong)this->_height * (ulong)this->_width; 0 < (long)uVar18;
        uVar18 = uVar18 - (raw._0_8_ & 0xffffffff)) {
      uVar7 = 0x1800000;
      if (uVar18 < 0x1800000) {
        uVar7 = uVar18;
      }
      assign(&raw,(uint)uVar7,1,1,1);
      cimg::fread<unsigned_char>(raw._data,raw._0_8_ & 0xffffffff,(FILE *)local_80);
      for (uVar7 = 0; (raw._0_8_ & 0xffffffff) != uVar7; uVar7 = uVar7 + 1) {
        puVar11[uVar7] = raw._data[uVar7];
      }
      puVar11 = puVar11 + uVar7;
    }
    goto LAB_001a33be;
  case 6:
    if (0xff < colormax) {
      raw._data = (uchar *)0x0;
      raw._width = 0;
      raw._height = 0;
      raw._depth = 0;
      raw._spectrum = 0;
      raw._is_shared = false;
      assign(this,W,H,1,3);
      puVar10 = this->_data;
      lVar5 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
      puVar11 = puVar10 + lVar5;
      puVar13 = puVar10 + lVar5 * 2;
      for (uVar18 = (ulong)this->_spectrum * lVar5; 0 < (long)uVar18;
          uVar18 = uVar18 - (raw._0_8_ & 0xffffffff)) {
        uVar7 = 0xc00000;
        if (uVar18 < 0xc00000) {
          uVar7 = uVar18;
        }
        CImg<unsigned_short>::assign((CImg<unsigned_short> *)&raw,(uint)uVar7,1,1,1);
        cimg::fread<unsigned_short>
                  ((unsigned_short *)raw._data,raw._0_8_ & 0xffffffff,(FILE *)__stream);
        cimg::invert_endianness<unsigned_short>((unsigned_short *)raw._data,raw._0_8_ & 0xffffffff);
        for (lVar5 = 0; ((raw._0_8_ & 0xffffffff) / 3) * 6 - lVar5 != 0; lVar5 = lVar5 + 6) {
          *puVar10 = raw._data[lVar5];
          puVar10 = puVar10 + 1;
          *puVar11 = raw._data[lVar5 + 2];
          puVar11 = puVar11 + 1;
          *puVar13 = raw._data[lVar5 + 4];
          puVar13 = puVar13 + 1;
        }
      }
      goto LAB_001a33ca;
    }
    raw._data = (uchar *)0x0;
    raw._width = 0;
    raw._height = 0;
    raw._depth = 0;
    raw._spectrum = 0;
    raw._is_shared = false;
    assign(this,W,H,1,3);
    puVar10 = this->_data;
    lVar5 = (ulong)this->_depth * (ulong)this->_height * (ulong)this->_width;
    puVar11 = puVar10 + lVar5;
    puVar13 = puVar10 + lVar5 * 2;
    for (uVar18 = (ulong)this->_spectrum * lVar5; 0 < (long)uVar18;
        uVar18 = uVar18 - (raw._0_8_ & 0xffffffff)) {
      uVar7 = 0x1800000;
      if (uVar18 < 0x1800000) {
        uVar7 = uVar18;
      }
      assign(&raw,(uint)uVar7,1,1,1);
      cimg::fread<unsigned_char>(raw._data,raw._0_8_ & 0xffffffff,(FILE *)__stream);
      for (lVar5 = 0; ((raw._0_8_ & 0xffffffff) / 3) * 3 != lVar5; lVar5 = lVar5 + 3) {
        *puVar10 = raw._data[lVar5];
        puVar10 = puVar10 + 1;
        *puVar11 = raw._data[lVar5 + 1];
        puVar11 = puVar11 + 1;
        *puVar13 = raw._data[lVar5 + 2];
        puVar13 = puVar13 + 1;
      }
    }
LAB_001a33be:
    ~CImg(&raw);
    break;
  case 8:
    raw._data = (uchar *)0x0;
    raw._width = 0;
    raw._height = 0;
    raw._depth = 0;
    raw._spectrum = 0;
    raw._is_shared = false;
    assign(this,W,H,D,1);
    puVar11 = this->_data;
    for (uVar18 = (ulong)this->_spectrum * (ulong)this->_depth *
                  (ulong)this->_height * (ulong)this->_width; 0 < (long)uVar18;
        uVar18 = uVar18 - (raw._0_8_ & 0xffffffff)) {
      uVar7 = 0x1800000;
      if (uVar18 < 0x1800000) {
        uVar7 = uVar18;
      }
      CImg<int>::assign((CImg<int> *)&raw,(uint)uVar7,1,1,1);
      cimg::fread<int>((int *)raw._data,raw._0_8_ & 0xffffffff,(FILE *)local_80);
      for (uVar7 = 0; (raw._0_8_ & 0xffffffff) != uVar7; uVar7 = uVar7 + 1) {
        puVar11[uVar7] = raw._data[uVar7 * 4];
      }
      puVar11 = puVar11 + uVar7;
    }
    CImg<int>::~CImg((CImg<int> *)&raw);
    break;
  case 9:
    raw._data = (uchar *)0x0;
    raw._width = 0;
    raw._height = 0;
    raw._depth = 0;
    raw._spectrum = 0;
    raw._is_shared = false;
    assign(this,W,H,D,1);
    puVar11 = this->_data;
    for (uVar18 = (ulong)this->_spectrum * (ulong)this->_depth *
                  (ulong)this->_height * (ulong)this->_width; 0 < (long)uVar18;
        uVar18 = uVar18 - (raw._0_8_ & 0xffffffff)) {
      uVar7 = 0x1800000;
      if (uVar18 < 0x1800000) {
        uVar7 = uVar18;
      }
      CImg<float>::assign((CImg<float> *)&raw,(uint)uVar7,1,1,1);
      cimg::fread<float>((float *)raw._data,raw._0_8_ & 0xffffffff,(FILE *)local_80);
      for (uVar7 = 0; (raw._0_8_ & 0xffffffff) != uVar7; uVar7 = uVar7 + 1) {
        puVar11[uVar7] = (uchar)(int)*(float *)(raw._data + uVar7 * 4);
      }
      puVar11 = puVar11 + uVar7;
    }
    CImg<float>::~CImg((CImg<float> *)&raw);
    break;
  default:
    assign(this);
    if (file == (FILE *)0x0) {
      cimg::fclose(__stream);
    }
    this_01 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar15 = "non-";
    if (this->_is_shared != false) {
      pcVar15 = "";
    }
    pcVar16 = "(FILE*)";
    if (filename != (char *)0x0) {
      pcVar16 = filename;
    }
    CImgIOException::CImgIOException
              (this_01,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pnm(): PNM type \'P%d\' found, but type is not supported."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar15,"unsigned char",pcVar16,(ulong)ppm_type);
    goto LAB_001a3563;
  }
  pCVar2 = local_70;
  if (file == (FILE *)0x0) {
    cimg::fclose(local_80);
  }
  CImg<char>::~CImg(&item);
  return pCVar2;
}

Assistant:

CImg<T>& _load_pnm(std::FILE *const file, const char *const filename) {
      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_pnm(): Specified filename is (null).",
                                    cimg_instance);

      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      unsigned int ppm_type, W, H, D = 1, colormax = 255;
      CImg<charT> item(16384,1,1,1,0);
      int err, rval, gval, bval;
      const longT cimg_iobuffer = (longT)24*1024*1024;
      while ((err=std::fscanf(nfile,"%16383[^\n]",item.data()))!=EOF && (*item=='#' || !err)) std::fgetc(nfile);
      if (cimg_sscanf(item," P%u",&ppm_type)!=1) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_pnm(): PNM header not found in file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }
      while ((err=std::fscanf(nfile," %16383[^\n]",item.data()))!=EOF && (*item=='#' || !err)) std::fgetc(nfile);
      if ((err=cimg_sscanf(item," %u %u %u %u",&W,&H,&D,&colormax))<2) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_pnm(): WIDTH and HEIGHT fields undefined in file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }
      if (ppm_type!=1 && ppm_type!=4) {
        if (err==2 || (err==3 && (ppm_type==5 || ppm_type==7 || ppm_type==8 || ppm_type==9))) {
          while ((err=std::fscanf(nfile," %16383[^\n]",item.data()))!=EOF && (*item=='#' || !err)) std::fgetc(nfile);
          if (cimg_sscanf(item,"%u",&colormax)!=1)
            cimg::warn(_cimg_instance
                       "load_pnm(): COLORMAX field is undefined in file '%s'.",
                       cimg_instance,
                       filename?filename:"(FILE*)");
        } else { colormax = D; D = 1; }
      }
      std::fgetc(nfile);

      switch (ppm_type) {
      case 1 : { // 2D b&w Ascii
        assign(W,H,1,1);
        T* ptrd = _data;
        cimg_foroff(*this,off) { if (std::fscanf(nfile,"%d",&rval)>0) *(ptrd++) = (T)(rval?0:255); else break; }
      } break;
      case 2 : { // 2D grey Ascii
        assign(W,H,1,1);
        T* ptrd = _data;
        cimg_foroff(*this,off) { if (std::fscanf(nfile,"%d",&rval)>0) *(ptrd++) = (T)rval; else break; }
      } break;
      case 3 : { // 2D color Ascii
        assign(W,H,1,3);
        T *ptrd = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2);
        cimg_forXY(*this,x,y) {
          if (std::fscanf(nfile,"%d %d %d",&rval,&gval,&bval)==3) {
            *(ptrd++) = (T)rval; *(ptr_g++) = (T)gval; *(ptr_b++) = (T)bval;
          } else break;
        }
      } break;
      case 4 : { // 2D b&w binary (support 3D PINK extension)
        CImg<ucharT> raw;
        assign(W,H,D,1);
        T *ptrd = data(0,0,0,0);
        unsigned int w = 0, h = 0, d = 0;
        for (longT to_read = (longT)((W/8 + (W%8?1:0))*H*D); to_read>0; ) {
          raw.assign(std::min(to_read,cimg_iobuffer));
          cimg::fread(raw._data,raw._width,nfile);
          to_read-=raw._width;
          const unsigned char *ptrs = raw._data;
          unsigned char mask = 0, val = 0;
          for (ulongT off = (ulongT)raw._width; off || mask; mask>>=1) {
            if (!mask) { if (off--) val = *(ptrs++); mask = 128; }
            *(ptrd++) = (T)((val&mask)?0:255);
            if (++w==W) { w = 0; mask = 0; if (++h==H) { h = 0; if (++d==D) break; }}
          }
        }
      } break;
      case 5 : case 7 : { // 2D/3D grey binary (support 3D PINK extension)
        if (colormax<256) { // 8 bits
          CImg<ucharT> raw;
          assign(W,H,D,1);
          T *ptrd = data(0,0,0,0);
          for (longT to_read = (longT)size(); to_read>0; ) {
            raw.assign(std::min(to_read,cimg_iobuffer));
            cimg::fread(raw._data,raw._width,nfile);
            to_read-=raw._width;
            const unsigned char *ptrs = raw._data;
            for (ulongT off = (ulongT)raw._width; off; --off) *(ptrd++) = (T)*(ptrs++);
          }
        } else { // 16 bits
          CImg<ushortT> raw;
          assign(W,H,D,1);
          T *ptrd = data(0,0,0,0);
          for (longT to_read = (longT)size(); to_read>0; ) {
            raw.assign(std::min(to_read,cimg_iobuffer/2));
            cimg::fread(raw._data,raw._width,nfile);
	    if (!cimg::endianness()) cimg::invert_endianness(raw._data,raw._width);
            to_read-=raw._width;
            const unsigned short *ptrs = raw._data;
            for (ulongT off = (ulongT)raw._width; off; --off) *(ptrd++) = (T)*(ptrs++);
          }
        }
      } break;
      case 6 : { // 2D color binary
        if (colormax<256) { // 8 bits
          CImg<ucharT> raw;
          assign(W,H,1,3);
          T
            *ptr_r = data(0,0,0,0),
            *ptr_g = data(0,0,0,1),
            *ptr_b = data(0,0,0,2);
          for (longT to_read = (longT)size(); to_read>0; ) {
            raw.assign(std::min(to_read,cimg_iobuffer));
            cimg::fread(raw._data,raw._width,nfile);
            to_read-=raw._width;
            const unsigned char *ptrs = raw._data;
            for (ulongT off = (ulongT)raw._width/3; off; --off) {
              *(ptr_r++) = (T)*(ptrs++);
              *(ptr_g++) = (T)*(ptrs++);
              *(ptr_b++) = (T)*(ptrs++);
            }
          }
        } else { // 16 bits
          CImg<ushortT> raw;
          assign(W,H,1,3);
          T
            *ptr_r = data(0,0,0,0),
            *ptr_g = data(0,0,0,1),
            *ptr_b = data(0,0,0,2);
          for (longT to_read = (longT)size(); to_read>0; ) {
            raw.assign(std::min(to_read,cimg_iobuffer/2));
            cimg::fread(raw._data,raw._width,nfile);
            if (!cimg::endianness()) cimg::invert_endianness(raw._data,raw._width);
            to_read-=raw._width;
            const unsigned short *ptrs = raw._data;
            for (ulongT off = (ulongT)raw._width/3; off; --off) {
              *(ptr_r++) = (T)*(ptrs++);
              *(ptr_g++) = (T)*(ptrs++);
              *(ptr_b++) = (T)*(ptrs++);
            }
          }
        }
      } break;
      case 8 : { // 2D/3D grey binary with int32 integers (PINK extension)
        CImg<intT> raw;
        assign(W,H,D,1);
        T *ptrd = data(0,0,0,0);
        for (longT to_read = (longT)size(); to_read>0; ) {
          raw.assign(std::min(to_read,cimg_iobuffer));
          cimg::fread(raw._data,raw._width,nfile);
          to_read-=raw._width;
          const int *ptrs = raw._data;
          for (ulongT off = (ulongT)raw._width; off; --off) *(ptrd++) = (T)*(ptrs++);
        }
      } break;
      case 9 : { // 2D/3D grey binary with float values (PINK extension)
        CImg<floatT> raw;
        assign(W,H,D,1);
        T *ptrd = data(0,0,0,0);
        for (longT to_read = (longT)size(); to_read>0; ) {
          raw.assign(std::min(to_read,cimg_iobuffer));
          cimg::fread(raw._data,raw._width,nfile);
          to_read-=raw._width;
          const float *ptrs = raw._data;
          for (ulongT off = (ulongT)raw._width; off; --off) *(ptrd++) = (T)*(ptrs++);
        }
      } break;
      default :
        assign();
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_pnm(): PNM type 'P%d' found, but type is not supported.",
                              cimg_instance,
                              filename?filename:"(FILE*)",ppm_type);
      }
      if (!file) cimg::fclose(nfile);
      return *this;
    }